

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tigervision.hpp
# Opt level: O0

void __thiscall
Atari2600::Cartridge::Tigervision::perform_bus_operation
          (Tigervision *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  int offset;
  uint8_t *value_local;
  uint16_t address_local;
  BusOperation operation_local;
  Tigervision *this_local;
  
  if ((address & 0x1fff) == 0x3f) {
    this->rom_ptr_[0] =
         (this->super_BusExtender).rom_base_ +
         (int)((uint)*value << 0xb & (int)(this->super_BusExtender).rom_size_ - 1U);
  }
  else if (((address & 0x1000) != 0) && ((int)operation < 5)) {
    *value = this->rom_ptr_[(int)((int)(uint)address >> 0xb & 1)][(int)(address & 0x7ff)];
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			if((address&0x1fff) == 0x3f) {
				int offset = ((*value) * 2048) & (rom_size_ - 1);
				rom_ptr_[0] = rom_base_ + offset;
				return;
			} else if((address&0x1000) && isReadOperation(operation)) {
				*value = rom_ptr_[(address >> 11)&1][address & 2047];
			}
		}